

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O0

void deqp::gls::setUniformValue
               (Functions *gl,vector<unsigned_int,_std::allocator<unsigned_int>_> *pipelinePrograms,
               string *name,Value *val,int arrayNdx,TestLog *log)

{
  value_type vVar1;
  code *pcVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  undefined8 uVar6;
  const_reference pvVar7;
  MessageBuilder *pMVar8;
  MessageBuilder local_1d0;
  int local_50;
  int local_4c;
  int elemNdx;
  int loc;
  int scalarSize;
  DataType dataType;
  int programNdx;
  bool foundAnyMatch;
  TestLog *log_local;
  Value *pVStack_28;
  int arrayNdx_local;
  Value *val_local;
  string *name_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pipelinePrograms_local;
  Functions *gl_local;
  
  dataType._3_1_ = TYPE_INVALID >> 0x18;
  _programNdx = log;
  log_local._4_4_ = arrayNdx;
  pVStack_28 = val;
  val_local = (Value *)name;
  name_local = (string *)pipelinePrograms;
  pipelinePrograms_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)gl;
  for (scalarSize = 0; iVar3 = scalarSize,
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)name_local),
      iVar3 < (int)sVar4; scalarSize = scalarSize + 1) {
    loc = glu::VarType::getBasicType(&pVStack_28->type);
    elemNdx = glu::getDataTypeScalarSize(loc);
    pcVar2 = (code *)pipelinePrograms_local[0x78].
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)name_local,
                        (long)scalarSize);
    vVar1 = *pvVar5;
    uVar6 = std::__cxx11::string::c_str();
    local_4c = (*pcVar2)(vVar1,uVar6);
    local_50 = log_local._4_4_ * elemNdx;
    if (local_4c != -1) {
      dataType._3_1_ = 1;
      pcVar2 = (code *)pipelinePrograms_local[0xf0].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)name_local,
                          (long)scalarSize);
      (*pcVar2)(*pvVar5);
      iVar3 = local_4c;
      switch(loc) {
      case 1:
        pcVar2 = (code *)pipelinePrograms_local[0xdf].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
        pvVar7 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&pVStack_28->elements,(long)local_50);
        (*pcVar2)(iVar3,1,pvVar7);
        break;
      case 2:
        pcVar2 = (code *)pipelinePrograms_local[0xe1].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
        pvVar7 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&pVStack_28->elements,(long)local_50);
        (*pcVar2)(iVar3,1,pvVar7);
        break;
      case 3:
        pcVar2 = (code *)pipelinePrograms_local[0xe4].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
        pvVar7 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&pVStack_28->elements,(long)local_50);
        (*pcVar2)(iVar3,1,pvVar7);
        break;
      case 4:
        pcVar2 = (code *)pipelinePrograms_local[0xe7].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
        pvVar7 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&pVStack_28->elements,(long)local_50);
        (*pcVar2)(iVar3,1,pvVar7);
        break;
      case 5:
        pcVar2 = (code *)pipelinePrograms_local[0xe9].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
        pvVar7 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&pVStack_28->elements,(long)local_50);
        (*pcVar2)(iVar3,1,0,pvVar7);
        break;
      case 6:
        pcVar2 = (code *)pipelinePrograms_local[0xea].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
        pvVar7 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&pVStack_28->elements,(long)local_50);
        (*pcVar2)(iVar3,1,0,pvVar7);
        break;
      case 7:
        pcVar2 = (code *)pipelinePrograms_local[0xea].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
        pvVar7 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&pVStack_28->elements,(long)local_50);
        (*pcVar2)(iVar3,1,0,pvVar7);
        break;
      case 8:
        pcVar2 = (code *)pipelinePrograms_local[0xec].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
        pvVar7 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&pVStack_28->elements,(long)local_50);
        (*pcVar2)(iVar3,1,0,pvVar7);
        break;
      case 9:
        pcVar2 = (code *)pipelinePrograms_local[0xeb].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
        pvVar7 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&pVStack_28->elements,(long)local_50);
        (*pcVar2)(iVar3,1,0,pvVar7);
        break;
      case 10:
        pcVar2 = (code *)pipelinePrograms_local[0xec].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
        pvVar7 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&pVStack_28->elements,(long)local_50);
        (*pcVar2)(iVar3,1,0,pvVar7);
        break;
      case 0xb:
        pcVar2 = (code *)pipelinePrograms_local[0xee].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
        pvVar7 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&pVStack_28->elements,(long)local_50);
        (*pcVar2)(iVar3,1,0,pvVar7);
        break;
      case 0xc:
        pcVar2 = (code *)pipelinePrograms_local[0xee].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
        pvVar7 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&pVStack_28->elements,(long)local_50);
        (*pcVar2)(iVar3,1,0,pvVar7);
        break;
      case 0xd:
        pcVar2 = (code *)pipelinePrograms_local[0xed].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
        pvVar7 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&pVStack_28->elements,(long)local_50);
        (*pcVar2)(iVar3,1,0,pvVar7);
        break;
      default:
        break;
      case 0x1b:
        pcVar2 = (code *)pipelinePrograms_local[0xdf].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
        pvVar7 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&pVStack_28->elements,(long)local_50);
        (*pcVar2)(iVar3,1,pvVar7);
        break;
      case 0x1c:
        pcVar2 = (code *)pipelinePrograms_local[0xe2].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
        pvVar7 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&pVStack_28->elements,(long)local_50);
        (*pcVar2)(iVar3,1,pvVar7);
        break;
      case 0x1d:
        pcVar2 = (code *)pipelinePrograms_local[0xe5].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
        pvVar7 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&pVStack_28->elements,(long)local_50);
        (*pcVar2)(iVar3,1,pvVar7);
        break;
      case 0x1e:
        pcVar2 = (code *)pipelinePrograms_local[0xe7].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
        pvVar7 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&pVStack_28->elements,(long)local_50);
        (*pcVar2)(iVar3,1,pvVar7);
        break;
      case 0x1f:
        pcVar2 = (code *)pipelinePrograms_local[0xe0].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
        pvVar7 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&pVStack_28->elements,(long)local_50);
        (*pcVar2)(iVar3,1,pvVar7);
        break;
      case 0x20:
        pcVar2 = (code *)pipelinePrograms_local[0xe3].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
        pvVar7 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&pVStack_28->elements,(long)local_50);
        (*pcVar2)(iVar3,1,pvVar7);
        break;
      case 0x21:
        pcVar2 = (code *)pipelinePrograms_local[0xe5].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
        pvVar7 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&pVStack_28->elements,(long)local_50);
        (*pcVar2)(iVar3,1,pvVar7);
        break;
      case 0x22:
        pcVar2 = (code *)pipelinePrograms_local[0xe8].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
        pvVar7 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&pVStack_28->elements,(long)local_50);
        (*pcVar2)(iVar3,1,pvVar7);
        break;
      case 0x23:
        pcVar2 = (code *)pipelinePrograms_local[0xdf].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
        pvVar7 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&pVStack_28->elements,(long)local_50);
        (*pcVar2)(iVar3,1,pvVar7);
        break;
      case 0x24:
        pcVar2 = (code *)pipelinePrograms_local[0xe2].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
        pvVar7 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&pVStack_28->elements,(long)local_50);
        (*pcVar2)(iVar3,1,pvVar7);
        break;
      case 0x25:
        pcVar2 = (code *)pipelinePrograms_local[0xe5].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
        pvVar7 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&pVStack_28->elements,(long)local_50);
        (*pcVar2)(iVar3,1,pvVar7);
        break;
      case 0x26:
        pcVar2 = (code *)pipelinePrograms_local[0xe7].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
        pvVar7 = std::vector<glu::sl::Value::Element,_std::allocator<glu::sl::Value::Element>_>::
                 operator[](&pVStack_28->elements,(long)local_50);
        (*pcVar2)(iVar3,1,pvVar7);
        break;
      case 0x28:
      case 0x29:
      }
    }
  }
  if ((dataType._3_1_ & 1) == TYPE_INVALID >> 0x18) {
    tcu::TestLog::operator<<(&local_1d0,_programNdx,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_1d0,(char (*) [21])"WARNING // Uniform \"");
    pMVar8 = tcu::MessageBuilder::operator<<
                       (pMVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               val_local);
    pMVar8 = tcu::MessageBuilder::operator<<
                       (pMVar8,(char (*) [73])
                               "\" location is not valid, location = -1. Cannot set value to the uniform."
                       );
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d0);
  }
  return;
}

Assistant:

static void setUniformValue (const glw::Functions& gl, const std::vector<deUint32>& pipelinePrograms, const std::string& name, const Value& val, int arrayNdx, tcu::TestLog& log)
{
	bool foundAnyMatch = false;

	for (int programNdx = 0; programNdx < (int)pipelinePrograms.size(); ++programNdx)
	{
		const DataType	dataType	= val.type.getBasicType();
		const int		scalarSize	= getDataTypeScalarSize(dataType);
		const int		loc			= gl.getUniformLocation(pipelinePrograms[programNdx], name.c_str());
		const int		elemNdx		= arrayNdx * scalarSize;

		DE_ASSERT(elemNdx+scalarSize <= (int)val.elements.size());

		if (loc == -1)
			continue;

		foundAnyMatch = true;

		DE_STATIC_ASSERT(sizeof(Value::Element) == sizeof(glw::GLfloat));
		DE_STATIC_ASSERT(sizeof(Value::Element) == sizeof(glw::GLint));

		gl.useProgram(pipelinePrograms[programNdx]);

		switch (dataType)
		{
			case TYPE_FLOAT:		gl.uniform1fv(loc, 1, &val.elements[elemNdx].float32);						break;
			case TYPE_FLOAT_VEC2:	gl.uniform2fv(loc, 1, &val.elements[elemNdx].float32);						break;
			case TYPE_FLOAT_VEC3:	gl.uniform3fv(loc, 1, &val.elements[elemNdx].float32);						break;
			case TYPE_FLOAT_VEC4:	gl.uniform4fv(loc, 1, &val.elements[elemNdx].float32);						break;
			case TYPE_FLOAT_MAT2:	gl.uniformMatrix2fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);		break;
			case TYPE_FLOAT_MAT3:	gl.uniformMatrix3fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);		break;
			case TYPE_FLOAT_MAT4:	gl.uniformMatrix4fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);		break;
			case TYPE_INT:			gl.uniform1iv(loc, 1, &val.elements[elemNdx].int32);						break;
			case TYPE_INT_VEC2:		gl.uniform2iv(loc, 1, &val.elements[elemNdx].int32);						break;
			case TYPE_INT_VEC3:		gl.uniform3iv(loc, 1, &val.elements[elemNdx].int32);						break;
			case TYPE_INT_VEC4:		gl.uniform4iv(loc, 1, &val.elements[elemNdx].int32);						break;
			case TYPE_BOOL:			gl.uniform1iv(loc, 1, &val.elements[elemNdx].int32);						break;
			case TYPE_BOOL_VEC2:	gl.uniform2iv(loc, 1, &val.elements[elemNdx].int32);						break;
			case TYPE_BOOL_VEC3:	gl.uniform3iv(loc, 1, &val.elements[elemNdx].int32);						break;
			case TYPE_BOOL_VEC4:	gl.uniform4iv(loc, 1, &val.elements[elemNdx].int32);						break;
			case TYPE_UINT:			gl.uniform1uiv(loc, 1, (const deUint32*)&val.elements[elemNdx].int32);		break;
			case TYPE_UINT_VEC2:	gl.uniform2uiv(loc, 1, (const deUint32*)&val.elements[elemNdx].int32);		break;
			case TYPE_UINT_VEC3:	gl.uniform3uiv(loc, 1, (const deUint32*)&val.elements[elemNdx].int32);		break;
			case TYPE_UINT_VEC4:	gl.uniform4uiv(loc, 1, (const deUint32*)&val.elements[elemNdx].int32);		break;
			case TYPE_FLOAT_MAT2X3:	gl.uniformMatrix2x3fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);	break;
			case TYPE_FLOAT_MAT2X4:	gl.uniformMatrix2x4fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);	break;
			case TYPE_FLOAT_MAT3X2:	gl.uniformMatrix3x2fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);	break;
			case TYPE_FLOAT_MAT3X4:	gl.uniformMatrix3x4fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);	break;
			case TYPE_FLOAT_MAT4X2:	gl.uniformMatrix4x2fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);	break;
			case TYPE_FLOAT_MAT4X3:	gl.uniformMatrix4x3fv(loc, 1, GL_FALSE, &val.elements[elemNdx].float32);	break;

			case TYPE_SAMPLER_2D:
			case TYPE_SAMPLER_CUBE:
				DE_FATAL("implement!");
				break;

			default:
				DE_ASSERT(false);
		}
	}

	if (!foundAnyMatch)
		log << tcu::TestLog::Message << "WARNING // Uniform \"" << name << "\" location is not valid, location = -1. Cannot set value to the uniform." << tcu::TestLog::EndMessage;
}